

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_syslog.c
# Opt level: O2

void ngx_syslog_writer(ngx_log_t *log,ngx_uint_t level,u_char *buf,size_t len)

{
  ngx_syslog_peer_t *peer;
  u_char *buf_00;
  u_char *puVar1;
  u_char local_968 [8];
  u_char msg [2359];
  
  peer = (ngx_syslog_peer_t *)log->wdata;
  if ((peer->field_0x128 & 1) == 0) {
    peer->field_0x128 = peer->field_0x128 | 1;
    peer->severity = level - 1;
    buf_00 = ngx_syslog_add_header(peer,local_968);
    puVar1 = msg + (0x92f - (long)buf_00);
    if ((u_char *)(len - 1) < msg + (0x92f - (long)buf_00)) {
      puVar1 = (u_char *)(len - 1);
    }
    puVar1 = ngx_snprintf(buf_00,(size_t)puVar1,"%s",buf);
    ngx_syslog_send(peer,local_968,(long)puVar1 - (long)local_968);
    peer->field_0x128 = peer->field_0x128 & 0xfe;
  }
  return;
}

Assistant:

void
ngx_syslog_writer(ngx_log_t *log, ngx_uint_t level, u_char *buf,
    size_t len)
{
    u_char             *p, msg[NGX_SYSLOG_MAX_STR];
    ngx_uint_t          head_len;
    ngx_syslog_peer_t  *peer;

    peer = log->wdata;

    if (peer->busy) {
        return;
    }

    peer->busy = 1;
    peer->severity = level - 1;

    p = ngx_syslog_add_header(peer, msg);
    head_len = p - msg;

    len -= NGX_LINEFEED_SIZE;

    if (len > NGX_SYSLOG_MAX_STR - head_len) {
        len = NGX_SYSLOG_MAX_STR - head_len;
    }

    p = ngx_snprintf(p, len, "%s", buf);

    (void) ngx_syslog_send(peer, msg, p - msg);

    peer->busy = 0;
}